

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loguru.cpp
# Opt level: O0

string * __thiscall
loguru::stacktrace_as_stdstring_abi_cxx11_(string *__return_storage_ptr__,loguru *this,int skip)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  char *pcVar4;
  undefined4 in_register_00000014;
  void *local_8f8;
  void *local_8f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8b8;
  int local_884;
  void *pvStack_880;
  int status;
  char *demangled;
  Dl_info info;
  char buf [1024];
  undefined1 local_450 [4];
  int i;
  string result;
  char **symbols;
  int num_frames;
  unsigned_long max_frames;
  void *callstack [128];
  int skip_local;
  
  callstack[0x7f]._4_4_ = (int)this;
  iVar1 = backtrace(&max_frames,0x80,CONCAT44(in_register_00000014,skip));
  result.field_2._8_8_ = backtrace_symbols(&max_frames,iVar1);
  std::__cxx11::string::string((string *)local_450);
  buf._1020_4_ = iVar1;
  while (buf._1020_4_ = buf._1020_4_ + -1, callstack[0x7f]._4_4_ <= (int)buf._1020_4_) {
    iVar2 = dladdr(callstack[(long)(int)buf._1020_4_ + -1],&demangled);
    if ((iVar2 == 0) || (info.dli_fbase == (void *)0x0)) {
      snprintf((char *)&info.dli_saddr,0x400,"%-3d %*p %s\n",
               (ulong)(uint)(buf._1020_4_ - callstack[0x7f]._4_4_),0x12,
               callstack[(long)(int)buf._1020_4_ + -1],
               *(undefined8 *)(result.field_2._8_8_ + (long)(int)buf._1020_4_ * 8));
    }
    else {
      pvStack_880 = (void *)0x0;
      local_884 = -1;
      if (*info.dli_fbase == '_') {
        pvStack_880 = (void *)__cxa_demangle(info.dli_fbase,0,0,&local_884);
      }
      if (local_884 == 0) {
        local_8f0 = pvStack_880;
      }
      else {
        if (info.dli_fbase == (void *)0x0) {
          local_8f8 = *(void **)(result.field_2._8_8_ + (long)(int)buf._1020_4_ * 8);
        }
        else {
          local_8f8 = info.dli_fbase;
        }
        local_8f0 = local_8f8;
      }
      snprintf((char *)&info.dli_saddr,0x400,"%-3d %*p %s + %zd\n",
               (ulong)(uint)(buf._1020_4_ - callstack[0x7f]._4_4_),0x12,
               callstack[(long)(int)buf._1020_4_ + -1],local_8f0,
               (long)callstack[(long)(int)buf._1020_4_ + -1] - (long)info.dli_sname);
      free(pvStack_880);
    }
    std::__cxx11::string::operator+=((string *)local_450,(char *)&info.dli_saddr);
  }
  free((void *)result.field_2._8_8_);
  if (iVar1 == 0x80) {
    std::operator+(&local_8b8,"[truncated]\n",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_450);
    std::__cxx11::string::operator=((string *)local_450,(string *)&local_8b8);
    std::__cxx11::string::~string((string *)&local_8b8);
  }
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    std::__cxx11::string::size();
    pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_450);
    if (*pcVar4 == '\n') {
      std::__cxx11::string::size();
      std::__cxx11::string::resize((ulong)local_450);
    }
  }
  prettify_stacktrace(__return_storage_ptr__,(string *)local_450);
  std::__cxx11::string::~string((string *)local_450);
  return __return_storage_ptr__;
}

Assistant:

std::string stacktrace_as_stdstring(int skip)
	{
		// From https://gist.github.com/fmela/591333
		void* callstack[128];
		const auto max_frames = sizeof(callstack) / sizeof(callstack[0]);
		int num_frames = backtrace(callstack, max_frames);
		char** symbols = backtrace_symbols(callstack, num_frames);

		std::string result;
		// Print stack traces so the most relevant ones are written last
		// Rationale: http://yellerapp.com/posts/2015-01-22-upside-down-stacktraces.html
		for (int i = num_frames - 1; i >= skip; --i) {
			char buf[1024];
			Dl_info info;
			if (dladdr(callstack[i], &info) && info.dli_sname) {
				char* demangled = NULL;
				int status = -1;
				if (info.dli_sname[0] == '_') {
					demangled = abi::__cxa_demangle(info.dli_sname, 0, 0, &status);
				}
				snprintf(buf, sizeof(buf), "%-3d %*p %s + %zd\n",
						 i - skip, int(2 + sizeof(void*) * 2), callstack[i],
						 status == 0 ? demangled :
						 info.dli_sname == 0 ? symbols[i] : info.dli_sname,
						 static_cast<char*>(callstack[i]) - static_cast<char*>(info.dli_saddr));
				free(demangled);
			} else {
				snprintf(buf, sizeof(buf), "%-3d %*p %s\n",
						 i - skip, int(2 + sizeof(void*) * 2), callstack[i], symbols[i]);
			}
			result += buf;
		}
		free(symbols);

		if (num_frames == max_frames) {
			result = "[truncated]\n" + result;
		}

		if (!result.empty() && result[result.size() - 1] == '\n') {
			result.resize(result.size() - 1);
		}

		return prettify_stacktrace(result);
	}